

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall wallet::LegacyScriptPubKeyMan::RewriteDB(LegacyScriptPubKeyMan *this)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
            (&(this->super_LegacyDataSPKM).setInternalKeyPool._M_t);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
            (&(this->super_LegacyDataSPKM).setExternalKeyPool._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_long>,_std::_Select1st<std::pair<const_CKeyID,_long>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
  ::clear(&(this->super_LegacyDataSPKM).m_pool_key_to_index._M_t);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::RewriteDB()
{
    LOCK(cs_KeyStore);
    setInternalKeyPool.clear();
    setExternalKeyPool.clear();
    m_pool_key_to_index.clear();
    // Note: can't top-up keypool here, because wallet is locked.
    // User will be prompted to unlock wallet the next operation
    // that requires a new key.
}